

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O2

void oversubscription(size_t W)

{
  char *pcVar1;
  Node *v;
  code *pcVar2;
  double dVar3;
  FlowBuilder this;
  char extraout_AL;
  char extraout_AL_00;
  TestCaseData *pTVar4;
  long *plVar5;
  ulong uVar6;
  Node *this_00;
  Enum EVar7;
  Executor *this_01;
  unsigned_long uVar8;
  unsigned_long uVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  unsigned_long local_368;
  ulong local_360;
  atomic<unsigned_long> *local_358;
  Enum local_350;
  atomic<unsigned_long> counter;
  ResultBuilder DOCTEST_RB;
  shared_ptr<tf::WorkerInterface> local_2c8;
  Result local_2b0;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  mutex mutex;
  Taskflow taskflow;
  Executor executor;
  
  tf::Taskflow::Taskflow(&taskflow);
  local_2c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_2c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,W,&local_2c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  counter.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super___mutex_base._M_mutex._8_8_ = 0;
  set._M_h._M_buckets = &set._M_h._M_single_bucket;
  set._M_h._M_bucket_count = 1;
  set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set._M_h._M_element_count = 0;
  set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set._M_h._M_rehash_policy._M_next_resize = 0;
  set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_360 = W >> 1;
  for (uVar6 = 0; uVar6 != local_360; uVar6 = uVar6 + 1) {
    v = (Node *)0x0;
    lVar10 = 100;
    while (this_00 = v, this._graph = taskflow.super_FlowBuilder._graph, lVar11 = lVar10 + -1,
          lVar10 != 0) {
      pTVar4 = (TestCaseData *)operator_new(0xd8);
      (pTVar4->m_file).field_0.data.ptr = (char *)0x0;
      *(uint **)((long)&(pTVar4->m_file).field_0 + 8) = &pTVar4->m_line;
      *(undefined8 *)((long)&(pTVar4->m_file).field_0 + 0x10) = 0;
      *(undefined1 *)&pTVar4->m_line = 0;
      pcVar1 = (char *)((long)&pTVar4[1].m_file.field_0 + 0x10);
      pTVar4->m_test_suite = (char *)0x0;
      pTVar4->m_description = (char *)0x0;
      pTVar4->m_skip = false;
      pTVar4->m_no_breaks = false;
      pTVar4->m_no_output = false;
      pTVar4->m_may_fail = false;
      pTVar4->m_should_fail = false;
      *(undefined3 *)&pTVar4->field_0x3d = 0;
      *(undefined8 *)&pTVar4->m_expected_failures = 0;
      pTVar4->m_timeout = (double)pcVar1;
      pTVar4[1].m_file.field_0.data.ptr = pcVar1;
      *(char ***)((long)&pTVar4[1].m_file.field_0 + 8) = &pTVar4[1].m_description;
      pTVar4[1].m_description = (char *)0x0;
      pTVar4[1].m_skip = false;
      pTVar4[1].m_no_breaks = false;
      pTVar4[1].m_no_output = false;
      pTVar4[1].m_may_fail = false;
      pTVar4[1].m_should_fail = false;
      *(undefined3 *)&pTVar4[1].field_0x3d = 0;
      *(undefined8 *)&pTVar4[1].m_expected_failures = 0;
      pTVar4[1].m_timeout = 0.0;
      pTVar4[2].m_file.field_0.data.ptr = (char *)0x0;
      plVar5 = (long *)operator_new(0x20);
      *plVar5 = (long)&mutex;
      plVar5[1] = (long)&set;
      plVar5[2] = (long)&executor;
      plVar5[3] = (long)&counter;
      *(long **)&pTVar4[1].m_skip = plVar5;
      pTVar4[2].m_file.field_0.data.ptr =
           (char *)std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:863:31)>
                   ::_M_invoke;
      pTVar4[1].m_timeout =
           (double)std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:863:31)>
                   ::_M_manager;
      *(undefined1 *)&pTVar4[2].m_name = 1;
      pTVar4[2].m_test_suite = (char *)0x0;
      pTVar4[2].m_description = (char *)0x0;
      DOCTEST_RB.super_AssertData.m_test_case = pTVar4;
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)this._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB)
      ;
      std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
                ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
      v = ((this._graph)->
          super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          ).
          super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
          super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
          super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
          super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      bVar12 = lVar10 != 100;
      lVar10 = lVar11;
      if (bVar12) {
        tf::Node::_precede(this_00,v);
      }
    }
  }
  uVar8 = local_360 * 100;
  lVar10 = 100;
  uVar9 = uVar8;
  while( true ) {
    bVar12 = lVar10 == 0;
    lVar10 = lVar10 + -1;
    if (bVar12) {
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&set._M_h);
      tf::Executor::~Executor(&executor);
      tf::Taskflow::~Taskflow(&taskflow);
      return;
    }
    std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&set._M_h);
    this_01 = &executor;
    tf::Executor::run((Future<void> *)&DOCTEST_RB.super_AssertData,this_01,&taskflow);
    std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB.super_AssertData,this_01);
    tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    EVar7 = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x373;
    DOCTEST_RB.super_AssertData.m_expr = "counter == 100*(W/2)*t";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_358 = &counter;
    local_368 = uVar9;
    local_350 = EVar7;
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    doctest::detail::Expression_lhs<std::atomic<unsigned_long>const&>::operator==
              (&local_2b0,(Expression_lhs<std::atomic<unsigned_long>const&> *)&local_358,&local_368)
    ;
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_2b0);
    doctest::String::~String(&local_2b0.m_decomp);
    dVar3 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                       (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if (extraout_AL != '\0') break;
    doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x374;
    DOCTEST_RB.super_AssertData.m_expr = "set.size() <= W/2";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_358 = (atomic<unsigned_long> *)set._M_h._M_element_count;
    local_368 = local_360;
    local_350 = EVar7;
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    (((void)(((doctest::detail::declval<unsigned_long_const>)())<=((doctest::detail::
    declval<unsigned_long>)()))),doctest::detail::Result{})doctest::detail::
    Expression_lhs<unsigned_long_const>::operator<=
              (&local_2b0,(Expression_lhs<unsigned_long_const> *)&local_358,&local_368);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_2b0);
    doctest::String::~String(&local_2b0.m_decomp);
    dVar3 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                       (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    if (extraout_AL_00 != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    uVar9 = uVar9 + uVar8;
  }
  pcVar2 = (code *)swi(3);
  (*pcVar2)(SUB84(dVar3,0));
  return;
}

Assistant:

void oversubscription(size_t W) {

  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> counter{0};
  
  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  for(size_t n = 0; n<W/2; n++) { 
  
    tf::Task prev, curr;

    for(size_t l=0; l<100; l++) {

      curr = taskflow.emplace([&](){
        // record worker
        {
          std::scoped_lock lock(mutex);
          set.insert(executor.this_worker_id());
        }
        counter.fetch_add(1, std::memory_order_relaxed);
      });

      if(l) {
        curr.succeed(prev);
      }

      prev = curr;
    }
  }

  for(size_t t=1; t<=100; t++) {
    set.clear();
    executor.run(taskflow).wait();
    REQUIRE(counter == 100*(W/2)*t);
    REQUIRE(set.size() <= W/2);
  }
}